

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

ostream * operator<<(ostream *strm,Company *obj)

{
  int iVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  
  Company::arrange(obj);
  poVar2 = operator<<((ostream *)&std::cout,obj->boss);
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar3 = 0;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployees(obj->boss);
    if (iVar1 <= lVar3) break;
    poVar2 = operator<<(strm,obj->employees[lVar3]);
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar3 = lVar3 + 1;
  }
  std::operator<<((ostream *)&std::cout,"budget: ");
  std::ostream::operator<<((ostream *)strm,obj->budget);
  return strm;
}

Assistant:

ostream &operator<<(ostream &strm, Company &obj) {
    obj.arrange();
    cout << *obj.boss << endl;
    for (int i = 0; i < obj.boss->getNumberOfEmployees(); ++i) {
        strm << *obj.employees[i] << endl;
    }
    cout << "budget: ";
    strm << obj.budget;
    return strm;
}